

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

unsigned_long tjBufSizeYUV2(int width,int pad,int height,int subsamp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint componentID;
  unsigned_long uVar4;
  long in_FS_OFFSET;
  
  if ((uint)subsamp < 6) {
    uVar4 = 0;
    componentID = 0;
    do {
      uVar2 = tjPlaneWidth(componentID,width,subsamp);
      uVar3 = tjPlaneHeight(componentID,height,subsamp);
      if ((int)(uVar2 | uVar3) < 0) goto LAB_0010c6c4;
      uVar4 = uVar4 + (ulong)uVar3 * (long)(int)(uVar2 + pad + -1 & -pad);
    } while ((subsamp != 3) && (bVar1 = componentID < 2, componentID = componentID + 1, bVar1));
  }
  else {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc0)," Invalid",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb8)," argumen",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjBufSiz",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"eYUV2():",8);
    *(undefined2 *)(in_FS_OFFSET + -0xb0) = 0x74;
LAB_0010c6c4:
    uVar4 = 0xffffffffffffffff;
  }
  return uVar4;
}

Assistant:

DLLEXPORT unsigned long tjBufSizeYUV2(int width, int pad, int height,
                                      int subsamp)
{
  unsigned long long retval = 0;
  int nc, i;

  if (subsamp < 0 || subsamp >= NUMSUBOPT)
    THROWG("tjBufSizeYUV2(): Invalid argument");

  nc = (subsamp == TJSAMP_GRAY ? 1 : 3);
  for (i = 0; i < nc; i++) {
    int pw = tjPlaneWidth(i, width, subsamp);
    int stride = PAD(pw, pad);
    int ph = tjPlaneHeight(i, height, subsamp);

    if (pw < 0 || ph < 0) return -1;
    else retval += (unsigned long long)stride * ph;
  }
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjBufSizeYUV2(): Image is too large");

bailout:
  return (unsigned long)retval;
}